

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O2

uint32_t window32(void *blob,int len,int start,int count)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  sbyte sVar4;
  byte bVar5;
  int iVar6;
  
  if (count == 0) {
    return 0;
  }
  uVar2 = (long)start % (long)(len << 3);
  uVar1 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / 0x20;
  iVar6 = (int)uVar1;
  bVar5 = (byte)count;
  if ((uVar2 & 0x1f) != 0) {
    bVar3 = (byte)uVar2 & 0x1f;
    sVar4 = (bVar5 < 0x21) * (' ' - bVar5);
    return ((*(uint *)((long)blob +
                      (long)(int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar1 & 0xffffffff)
                                 % (long)(len / 4)) * 4) >> bVar3 |
            *(int *)((long)blob + (long)((iVar6 + 1) % (len / 4)) * 4) << 0x20 - bVar3) << sVar4) >>
           sVar4;
  }
  sVar4 = (bVar5 < 0x21) * (' ' - bVar5);
  return (uint)(*(int *)((long)blob + (long)iVar6 * 4) << sVar4) >> sVar4;
}

Assistant:

uint32_t window32 ( void * blob, int len, int start, int count )
{
  int nbits = len*8;
  start %= nbits;

  assert((len & 3) == 0);

  int ndwords = len / 4;

  uint32_t * k = (uint32_t*)blob;

  if(count == 0) return 0;

  int c = start & (32-1);
  int d = start / 32;

  if(c == 0) return (k[d] & ((1 << count) - 1));

  int ia = (d + 1) % ndwords;
  int ib = (d + 0) % ndwords;

  uint32_t a = k[ia];
  uint32_t b = k[ib];

  uint32_t t = (a << (32-c)) | (b >> c);

  t &= ((1 << count)-1);

  return t;
}